

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void trompeloeil::report_match<void()>(call_matcher_list<void_()> *matcher_list)

{
  list_elem<trompeloeil::call_matcher_base<void_()>_> *plVar1;
  char *in_stack_ffffffffffffffc8;
  allocator<char> local_29;
  long *local_28 [2];
  long local_18 [2];
  
  plVar1 = (matcher_list->
           super_list<trompeloeil::call_matcher_base<void_()>,_trompeloeil::ignore_disposer>).
           super_list_elem<trompeloeil::call_matcher_base<void_()>_>.next;
  if (plVar1 != (list_elem<trompeloeil::call_matcher_base<void_()>_> *)matcher_list) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_28,(char *)plVar1[1].prev,&local_29);
    reporter<trompeloeil::specialized>::sendOk(in_stack_ffffffffffffffc8);
    if (local_28[0] != local_18) {
      operator_delete(local_28[0],local_18[0] + 1);
    }
  }
  return;
}

Assistant:

auto
  list<T, Disposer>::begin()
  const
  noexcept
  -> iterator
  {
    return {next};
  }